

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall helics::BrokerBase::configureBase(BrokerBase *this)

{
  pointer pcVar1;
  BaseTimeCoordinator *pBVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  BrokerBase *local_68;
  thread local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (this->debugging == true) {
    this->no_ping = true;
    this->disable_timer = true;
  }
  if ((this->networkTimeout).internalTimeCode < 0) {
    (this->networkTimeout).internalTimeCode = 4000000000;
  }
  sVar4 = (this->identifier)._M_string_length;
  if (sVar4 == 0 && this->noAutomaticID == false) {
    genId_abi_cxx11_();
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->identifier,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    sVar4 = (this->identifier)._M_string_length;
  }
  if ((((sVar4 == 0x24) && (pcVar1 = (this->identifier)._M_dataplus._M_p, pcVar1[8] == '-')) &&
      (pcVar1[0xc] == '-')) && ((pcVar1[0x10] == '-' && (pcVar1[0x14] == '-')))) {
    this->uuid_like = true;
  }
  if (this->asyncTime == true) {
    CLI::std::make_unique<helics::AsyncTimeCoordinator>();
  }
  else {
    if (this->globalTime != true) {
      CLI::std::make_unique<helics::ForwardingTimeCoordinator>();
      _Var3._M_p = local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)0x0;
      pBVar2 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (this->timeCoord)._M_t.
      super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
      .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl =
           (BaseTimeCoordinator *)_Var3._M_p;
      if (pBVar2 != (BaseTimeCoordinator *)0x0) {
        (*pBVar2->_vptr_BaseTimeCoordinator[1])();
        if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
        }
      }
      goto LAB_0028161f;
    }
    CLI::std::make_unique<helics::GlobalTimeCoordinator>();
  }
  _Var3._M_p = local_88._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)0x0;
  pBVar2 = (this->timeCoord)._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl =
       (BaseTimeCoordinator *)_Var3._M_p;
  if (pBVar2 != (BaseTimeCoordinator *)0x0) {
    (*pBVar2->_vptr_BaseTimeCoordinator[1])();
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  this->hasTimeDependency = true;
LAB_0028161f:
  local_58._8_8_ = 0;
  local_40 = CLI::std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:542:33)>
             ::_M_invoke;
  local_48 = CLI::std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:542:33)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  BaseTimeCoordinator::setMessageSender
            ((this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
             (function<void_(const_helics::ActionMessage_&)> *)&local_58);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ((this->timeCoord)._M_t.
   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
   ._M_t.
   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
  restrictive_time_policy = this->restrictive_time_policy;
  local_38._8_8_ = 0;
  local_20 = CLI::std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:545:38)>
             ::_M_invoke;
  local_28 = CLI::std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:545:38)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)
             &((this->mLogManager).
               super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mTransmit
             ,(function<void_(helics::ActionMessage_&&)> *)&local_38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  LogManager::initializeLogging
            ((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&this->identifier);
  LOCK();
  (this->maxLogLevel).super___atomic_base<int>._M_i =
       (((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->maxLogLevel).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->mainLoopIsRunning)._M_base._M_i = true;
  UNLOCK();
  local_88._M_dataplus._M_p = (pointer)queueProcessingLoop;
  local_88._M_string_length = 0;
  local_68 = this;
  std::thread::thread<void(helics::BrokerBase::*)(),helics::BrokerBase*,void>
            (&local_60,(type *)&local_88,&local_68);
  CLI::std::thread::operator=(&this->queueProcessingThread,(thread *)&local_60);
  CLI::std::thread::~thread((thread *)&local_60);
  LOCK();
  (this->brokerState)._M_i = CONFIGURED;
  UNLOCK();
  return;
}

Assistant:

void BrokerBase::configureBase()
{
    if (debugging) {
        no_ping = true;
        disable_timer = true;
    }
    if (networkTimeout < timeZero) {
        networkTimeout = 4.0;
    }

    if (!noAutomaticID) {
        if (identifier.empty()) {
            identifier = genId();
        }
    }

    if (identifier.size() == 36) {
        if (identifier[8] == '-' && identifier[12] == '-' && identifier[16] == '-' &&
            identifier[20] == '-') {
            uuid_like = true;
        }
    }
    if (asyncTime) {
        timeCoord = std::make_unique<AsyncTimeCoordinator>();
        hasTimeDependency = true;
    } else if (globalTime) {
        timeCoord = std::make_unique<GlobalTimeCoordinator>();
        hasTimeDependency = true;
    } else {
        timeCoord = std::make_unique<ForwardingTimeCoordinator>();
    }

    timeCoord->setMessageSender([this](const ActionMessage& msg) { addActionMessage(msg); });
    timeCoord->setRestrictivePolicy(restrictive_time_policy);

    mLogManager->setTransmitCallback([this](ActionMessage&& message) {
        if (getBrokerState() < BrokerState::TERMINATING) {
            message.source_id = global_id.load();
            addActionMessage(std::move(message));
        }
    });
    mLogManager->initializeLogging(identifier);
    maxLogLevel.store(mLogManager->getMaxLevel());
    mainLoopIsRunning.store(true);
    queueProcessingThread = std::thread(&BrokerBase::queueProcessingLoop, this);
    brokerState = BrokerState::CONFIGURED;
}